

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_239b3a::SQLiteBuildDB::getKeysWithResult
          (SQLiteBuildDB *this,
          vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *keys_out,
          vector<llbuild::core::Result,_std::allocator<llbuild::core::Result>_> *results_out,
          string *error_out)

{
  sqlite3_stmt *psVar1;
  uint uVar2;
  int iVar3;
  uint64_t uVar4;
  char *data;
  undefined4 extraout_var;
  KeyID *pKVar5;
  DBKeyID *pDVar6;
  uchar *__dest;
  void *pvVar7;
  size_t __nbytes;
  ulong uVar8;
  ulong uVar9;
  int __oflag;
  void *extraout_RDX;
  void *extraout_RDX_00;
  bool bVar10;
  CommandSignature local_210;
  ValueTy local_208;
  ValueTy local_200;
  KeyID local_1f8;
  KeyID keyID;
  DBKeyID dbKeyID_1;
  bool singleUse;
  ulong uStack_1e0;
  bool orderOnly;
  uint64_t raw;
  undefined1 auStack_1d0 [4];
  int i;
  size_t local_1c8;
  undefined1 local_1c0 [8];
  BinaryDecoder decoder;
  Twine local_190;
  Twine local_178;
  string local_160;
  int local_13c;
  undefined8 uStack_138;
  int numDependencies;
  void *dependencyBytes;
  int numDependencyBytes;
  int numValueBytes;
  Result result_1;
  KeyID engineKeyID;
  KeyType key;
  DBKeyID dbKeyID;
  int result;
  sqlite3_stmt *stmt;
  lock_guard<std::mutex> local_50;
  lock_guard<std::mutex> guard;
  string *error_out_local;
  vector<llbuild::core::Result,_std::allocator<llbuild::core::Result>_> *results_out_local;
  vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *keys_out_local;
  SQLiteBuildDB *this_local;
  
  guard._M_device = (mutex_type *)error_out;
  if (this->delegate == (BuildDBDelegate *)0x0) {
    __assert_fail("delegate != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                  ,0x2e4,
                  "virtual bool (anonymous namespace)::SQLiteBuildDB::getKeysWithResult(std::vector<KeyType> &, std::vector<Result> &, std::string *)"
                 );
  }
  std::lock_guard<std::mutex>::lock_guard(&local_50,&this->dbMutex);
  uVar2 = open(this,(char *)guard._M_device,__oflag);
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = 0;
  }
  else {
    psVar1 = this->getKeysWithResultStmt;
    iVar3 = sqlite3_reset(psVar1);
    if (iVar3 == 0) {
      do {
        iVar3 = sqlite3_step(psVar1);
        if (iVar3 != 100) {
          this_local._7_1_ = 1;
          break;
        }
        iVar3 = sqlite3_column_count(psVar1);
        if (iVar3 != 9) {
          __assert_fail("sqlite3_column_count(stmt) == 9",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                        ,0x2f0,
                        "virtual bool (anonymous namespace)::SQLiteBuildDB::getKeysWithResult(std::vector<KeyType> &, std::vector<Result> &, std::string *)"
                       );
        }
        uVar4 = sqlite3_column_int64(psVar1,0);
        DBKeyID::DBKeyID((DBKeyID *)((long)&key.key.field_2 + 8),uVar4);
        data = (char *)sqlite3_column_text(psVar1,1);
        iVar3 = sqlite3_column_bytes(psVar1,1);
        llbuild::core::KeyType::KeyType((KeyType *)&engineKeyID,data,(long)iVar3);
        iVar3 = (*this->delegate->_vptr_BuildDBDelegate[2])(this->delegate,&engineKeyID);
        result_1.end = (Timestamp)CONCAT44(extraout_var,iVar3);
        pKVar5 = llvm::
                 DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                 ::operator[]((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                               *)&this->engineKeyIDs,(DBKeyID *)((long)&key.key.field_2 + 8));
        pKVar5->_value = (ValueTy)result_1.end;
        pDVar6 = llvm::
                 DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                 ::operator[]((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                               *)&this->dbKeyIDs,(KeyID *)&result_1.end);
        pDVar6->value = key.key.field_2._8_8_;
        llbuild::core::Result::Result((Result *)&numDependencyBytes);
        dependencyBytes._4_4_ = sqlite3_column_bytes(psVar1,2);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&numDependencyBytes,
                   (long)dependencyBytes._4_4_);
        __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &numDependencyBytes);
        pvVar7 = (void *)sqlite3_column_blob(psVar1,2);
        memcpy(__dest,pvVar7,(long)dependencyBytes._4_4_);
        result_1.computedAt = sqlite3_column_int64(psVar1,3);
        result_1.signature.value = sqlite3_column_int64(psVar1,4);
        result_1.dependencies.flags.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)sqlite3_column_double(psVar1,5);
        result_1.start = (Timestamp)sqlite3_column_double(psVar1,6);
        dependencyBytes._0_4_ = sqlite3_column_bytes(psVar1,7);
        uStack_138 = sqlite3_column_blob(psVar1,7);
        local_13c = (int)((ulong)(long)(int)dependencyBytes >> 3);
        if ((int)dependencyBytes == local_13c << 3) {
          llbuild::core::DependencyKeyIDs::resize
                    ((DependencyKeyIDs *)&result_1.builtAt,(long)local_13c);
          __nbytes = (size_t)(int)dependencyBytes;
          _auStack_1d0 = uStack_138;
          local_1c8 = __nbytes;
          llbuild::basic::BinaryDecoder::BinaryDecoder((BinaryDecoder *)local_1c0,_auStack_1d0);
          pvVar7 = extraout_RDX;
          for (raw._4_4_ = 0; raw._4_4_ != local_13c; raw._4_4_ = raw._4_4_ + 1) {
            llbuild::basic::BinaryDecoder::read
                      ((BinaryDecoder *)local_1c0,(int)&stack0xfffffffffffffe20,pvVar7,__nbytes);
            bVar10 = (uStack_1e0 & 1) != 0;
            uVar8 = uStack_1e0 >> 1;
            DBKeyID::DBKeyID((DBKeyID *)&keyID,uStack_1e0 >> 2);
            local_200 = keyID._value;
            local_1f8 = getKeyIDForID(this,keyID._value,(string *)guard._M_device);
            uVar9 = std::__cxx11::string::empty();
            if ((uVar9 & 1) == 0) {
              this_local._7_1_ = 0;
              bVar10 = true;
              goto LAB_0020f746;
            }
            local_208 = local_1f8._value;
            __nbytes = (size_t)bVar10;
            llbuild::core::DependencyKeyIDs::set
                      ((DependencyKeyIDs *)&result_1.builtAt,(long)raw._4_4_,local_1f8,bVar10,
                       (uVar8 & 1) != 0);
            pvVar7 = extraout_RDX_00;
          }
          uVar4 = sqlite3_column_int64(psVar1,8);
          llbuild::basic::CommandSignature::CommandSignature(&local_210,uVar4);
          result_1.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_210.value;
          std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::push_back
                    (keys_out,(value_type *)&engineKeyID);
          std::vector<llbuild::core::Result,_std::allocator<llbuild::core::Result>_>::push_back
                    (results_out,(value_type *)&numDependencyBytes);
          bVar10 = false;
        }
        else {
          llvm::Twine::Twine(&local_190,"unexpected contents for database result: ");
          llvm::Twine::Twine((Twine *)&decoder.pos,(int)key.key.field_2._8_8_);
          llvm::operator+(&local_178,&local_190,(Twine *)&decoder.pos);
          llvm::Twine::str_abi_cxx11_(&local_160,&local_178);
          std::__cxx11::string::operator=((string *)guard._M_device,(string *)&local_160);
          std::__cxx11::string::~string((string *)&local_160);
          this_local._7_1_ = 0;
          bVar10 = true;
        }
LAB_0020f746:
        llbuild::core::Result::~Result((Result *)&numDependencyBytes);
        llbuild::core::KeyType::~KeyType((KeyType *)&engineKeyID);
      } while (!bVar10);
    }
    else {
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                ((string *)&dbKeyID,this);
      std::__cxx11::string::operator=((string *)guard._M_device,(string *)&dbKeyID);
      std::__cxx11::string::~string((string *)&dbKeyID);
      this_local._7_1_ = 0;
    }
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool getKeysWithResult(std::vector<KeyType> &keys_out, std::vector<Result> &results_out, std::string* error_out) override {
    
    assert(delegate != nullptr);
    std::lock_guard<std::mutex> guard(dbMutex);
    
    if (!open(error_out))
      return false;
    
    auto stmt = getKeysWithResultStmt;
    
    int result = sqlite3_reset(stmt);
    checkSQLiteResultOKReturnFalse(result);
    
    while (sqlite3_step(stmt) == SQLITE_ROW) {
      assert(sqlite3_column_count(stmt) == 9);
      
      auto dbKeyID = DBKeyID(sqlite3_column_int64(stmt, 0));
      auto key = KeyType((const char *)sqlite3_column_text(stmt, 1), sqlite3_column_bytes(stmt, 1));
      
      auto engineKeyID = delegate->getKeyID(key);
      engineKeyIDs[dbKeyID] = engineKeyID;
      dbKeyIDs[engineKeyID] = dbKeyID;
      
      Result result;
      int numValueBytes = sqlite3_column_bytes(stmt, 2);
      result.value.resize(numValueBytes);
      memcpy(result.value.data(),
             sqlite3_column_blob(stmt, 2),
             numValueBytes);
      result.builtAt = sqlite3_column_int64(stmt, 3);
      result.computedAt = sqlite3_column_int64(stmt, 4);
      result.start = sqlite3_column_double(stmt, 5);
      result.end = sqlite3_column_double(stmt, 6);
      auto numDependencyBytes = sqlite3_column_bytes(stmt, 7);
      auto dependencyBytes = sqlite3_column_blob(stmt, 7);
      
      // map dependencies
      int numDependencies = numDependencyBytes / sizeof(uint64_t);
      if (numDependencyBytes != static_cast<int>(numDependencies * sizeof(uint64_t))) {
        *error_out = (llvm::Twine("unexpected contents for database result: ") +
                      llvm::Twine((int)dbKeyID.value)).str();
        return false;
      }

      result.dependencies.resize(numDependencies);
      basic::BinaryDecoder decoder(
                                   StringRef((const char*)dependencyBytes, numDependencyBytes));
      for (auto i = 0; i != numDependencies; ++i) {
        uint64_t raw;
        decoder.read(raw);
        bool orderOnly = raw & 1;
        bool singleUse = (raw >> 1) & 1;
        DBKeyID dbKeyID(raw >> 2);
        
        // Map the database key ID into an engine key ID (note that we already
        // hold the dbMutex at this point as required by getKeyIDforID())
        KeyID keyID = getKeyIDForID(dbKeyID, error_out);
        if (!error_out->empty()) {
          return false;
        }
        result.dependencies.set(i, keyID, orderOnly, singleUse);
      }
      
      result.signature = basic::CommandSignature(sqlite3_column_int64(stmt, 8));
      
      keys_out.push_back(key);
      results_out.push_back(result);
    }
    
    return true;
  }